

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpegtexture.cpp
# Opt level: O2

FTexture * JPEGTexture_TryCreate(FileReader *data,int lumpnum)

{
  _func_int *p_Var1;
  undefined4 in_EAX;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  FJPEGTexture *this;
  anon_union_4_3_c8de7888 first4bytes;
  int local_34;
  
  _first4bytes = CONCAT44(lumpnum,in_EAX);
  this = (FJPEGTexture *)0x0;
  (*(data->super_FileReaderBase)._vptr_FileReaderBase[4])(data,0,0);
  iVar2 = (*(data->super_FileReaderBase)._vptr_FileReaderBase[2])(data,&first4bytes,4);
  if (3 < CONCAT44(extraout_var,iVar2)) {
    this = (FJPEGTexture *)0x0;
    if (((first4bytes.b[0] == 0xff) && (first4bytes.b[1] == 0xd8)) && (first4bytes.b[2] == 0xff)) {
      while( true ) {
        p_Var1 = (data->super_FileReaderBase)._vptr_FileReaderBase[2];
        if (0xfffffffc < first4bytes.b[3] - 0xc3) break;
        iVar2 = (*p_Var1)(data,&first4bytes,2);
        if (CONCAT44(extraout_var_00,iVar2) != 2) {
          return (FTexture *)0x0;
        }
        (*(data->super_FileReaderBase)._vptr_FileReaderBase[4])
                  (data,(ulong)(ushort)(first4bytes.w[0] << 8 | first4bytes.w[0] >> 8) - 2,1);
        iVar2 = (*(data->super_FileReaderBase)._vptr_FileReaderBase[2])(data,first4bytes.w + 1,2);
        if (CONCAT44(extraout_var_01,iVar2) != 2) {
          return (FTexture *)0x0;
        }
        if (first4bytes.b[2] != 0xff) {
          return (FTexture *)0x0;
        }
      }
      iVar2 = (*p_Var1)(data,&first4bytes,3);
      if (((CONCAT44(extraout_var_02,iVar2) == 3) &&
          (4 < (ushort)(first4bytes.w[0] << 8 | first4bytes.w[0] >> 8))) &&
         (iVar2 = (*(data->super_FileReaderBase)._vptr_FileReaderBase[2])(data,&first4bytes,4),
         CONCAT44(extraout_var_03,iVar2) == 4)) {
        this = (FJPEGTexture *)operator_new(0xa8);
        FJPEGTexture::FJPEGTexture
                  (this,local_34,(uint)(ushort)(first4bytes.w[1] << 8 | first4bytes.w[1] >> 8),
                   (uint)(ushort)(first4bytes.w[0] << 8 | first4bytes.w[0] >> 8));
      }
      else {
        this = (FJPEGTexture *)0x0;
      }
    }
  }
  return &this->super_FTexture;
}

Assistant:

FTexture *JPEGTexture_TryCreate(FileReader & data, int lumpnum)
{
	union
	{
		DWORD dw;
		WORD w[2];
		BYTE b[4];
	} first4bytes;

	data.Seek(0, SEEK_SET);
	if (data.Read(&first4bytes, 4) < 4) return NULL;

	if (first4bytes.b[0] != 0xFF || first4bytes.b[1] != 0xD8 || first4bytes.b[2] != 0xFF)
		return NULL;

	// Find the SOFn marker to extract the image dimensions,
	// where n is 0, 1, or 2 (other types are unsupported).
	while ((unsigned)first4bytes.b[3] - 0xC0 >= 3)
	{
		if (data.Read (first4bytes.w, 2) != 2)
		{
			return NULL;
		}
		data.Seek (BigShort(first4bytes.w[0]) - 2, SEEK_CUR);
		if (data.Read (first4bytes.b + 2, 2) != 2 || first4bytes.b[2] != 0xFF)
		{
			return NULL;
		}
	}
	if (data.Read (first4bytes.b, 3) != 3)
	{
		return NULL;
	}
	if (BigShort (first4bytes.w[0]) < 5)
	{
		return NULL;
	}
	if (data.Read (first4bytes.b, 4) != 4)
	{
		return NULL;
	}
	return new FJPEGTexture (lumpnum, BigShort(first4bytes.w[1]), BigShort(first4bytes.w[0]));
}